

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::ConvertSkelAnimation
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,Path *abs_path,
          SkelAnimation *skelAnim,Animation *anim_out)

{
  storage_t<std::array<float,_3UL>_> *psVar1;
  pointer *ppAVar2;
  pointer *ppAVar3;
  pointer *ppAVar4;
  storage_t<std::array<float,_4UL>_> *psVar5;
  Stage *pSVar6;
  pointer paVar7;
  undefined8 uVar8;
  pointer pcVar9;
  iterator iVar10;
  iterator __position;
  iterator __position_00;
  void *pvVar11;
  pointer pSVar12;
  bool bVar13;
  pointer pTVar14;
  Animation *pAVar15;
  bool bVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  ostream *poVar20;
  mapped_type *pmVar21;
  _Base_ptr p_Var22;
  undefined8 *puVar23;
  char *pcVar24;
  iterator __begin3;
  string *psVar25;
  key_type *__k;
  pointer pSVar26;
  uint64_t uVar27;
  pointer in;
  char *pcVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  Path *in_R9;
  long lVar30;
  ulong uVar31;
  iterator __end3;
  pointer pcVar32;
  byte bVar33;
  AnimationSample<std::array<float,_3UL>_> s;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> translation;
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  rotations;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> _rotation;
  Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  translations;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> blendShapes;
  Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  scales;
  StringAndIdMap jointIdMap;
  ostringstream ss_e;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  channelMap;
  float in_stack_fffffffffffffc08;
  float fVar34;
  float in_stack_fffffffffffffc0c;
  _Alloc_hider _Var35;
  float fVar36;
  float fStack_3f0;
  float fStack_3ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  Path *local_3d8;
  RenderSceneConverter *local_3d0;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_3c8;
  string local_3b0;
  pointer local_390;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_388;
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  string local_328;
  undefined1 local_308 [10];
  undefined2 uStack_2fe;
  undefined4 uStack_2fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  local_288;
  Animation *local_260;
  undefined1 local_258 [32];
  undefined1 local_238 [17];
  undefined7 uStack_227;
  _Rb_tree_node_base _Stack_220;
  uint64_t local_200;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [6];
  ios_base local_178 [264];
  RenderSceneConverterEnv *local_70;
  unsigned_long local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  local_60;
  
  local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d8 = abs_path;
  local_3d0 = this;
  local_260 = anim_out;
  if (((((skelAnim->joints)._attrib.has_value_ != false) ||
       ((skelAnim->joints)._paths.
        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (skelAnim->joints)._paths.
        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start)) || ((skelAnim->joints)._value_empty != false)) ||
     ((skelAnim->joints)._blocked == true)) {
    pSVar6 = env->stage;
    local_1e8._0_8_ = local_1d8;
    local_70 = env;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"joints","");
    local_390 = (pointer)&local_3d0->_err;
    bVar16 = EvaluateTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                       (pSVar6,&skelAnim->joints,(string *)local_1e8,&local_3c8,(string *)local_390)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
    }
    if (bVar16) {
      if ((((((skelAnim->rotations)._attrib.has_value_ != false) ||
            ((skelAnim->rotations)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (skelAnim->rotations)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start)) ||
           (((skelAnim->rotations)._value_empty != false || ((skelAnim->rotations)._blocked == true)
            ))) && ((((skelAnim->translations)._attrib.has_value_ != false ||
                     ((skelAnim->translations)._paths.
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      (skelAnim->translations)._paths.
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_start)) ||
                    (((skelAnim->translations)._value_empty != false ||
                     ((skelAnim->translations)._blocked == true)))))) &&
         ((((env = local_70, (skelAnim->scales)._attrib.has_value_ != false ||
            ((skelAnim->scales)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             (skelAnim->scales)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start)) || ((skelAnim->scales)._value_empty != false)) ||
          ((skelAnim->scales)._blocked != false)))) goto LAB_0035af74;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
      poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1531);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
      local_308._0_8_ = &local_2f8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_308,
                 "`translations`, `rotations` and `scales` must be all authored for SkelAnimation Prim {}. authored flags: translations {}, rotations {}, scales {}"
                 ,"");
      local_60._M_impl._0_8_ = "yes";
      local_368._0_8_ = "yes";
      if ((((skelAnim->translations)._attrib.has_value_ == false) &&
          (local_368._0_8_ = "yes",
          (skelAnim->translations)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (skelAnim->translations)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start)) &&
         ((local_368._0_8_ = "yes", (skelAnim->translations)._value_empty == false &&
          (local_368._0_8_ = "no", (skelAnim->translations)._blocked != false)))) {
        local_368._0_8_ = "yes";
      }
      local_2a8._0_8_ = "yes";
      if ((((skelAnim->rotations)._attrib.has_value_ == false) &&
          (local_2a8._0_8_ = "yes",
          (skelAnim->rotations)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (skelAnim->rotations)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start)) &&
         ((local_2a8._0_8_ = "yes", (skelAnim->rotations)._value_empty == false &&
          (local_2a8._0_8_ = (long)"mono" + 2, (skelAnim->rotations)._blocked != false)))) {
        local_2a8._0_8_ = "yes";
      }
      if (((((skelAnim->scales)._attrib.has_value_ == false) &&
           ((skelAnim->scales)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (skelAnim->scales)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start)) && ((skelAnim->scales)._value_empty == false)) &&
         (local_60._M_impl._0_8_ = "no", (skelAnim->scales)._blocked != false)) {
        local_60._M_impl._0_8_ = "yes";
      }
      fmt::format<tinyusdz::Path,char_const*,char_const*,char_const*>
                ((string *)local_258,(fmt *)local_308,(string *)local_3d8,(Path *)local_368,
                 (char **)local_2a8,(char **)&local_60,
                 (char **)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,(char *)local_258._0_8_,
                           CONCAT44(local_258._12_4_,CONCAT22(local_258._10_2_,local_258._8_2_)));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_,CONCAT62(local_258._18_6_,local_258._16_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._0_8_ != &local_2f8) {
        operator_delete((void *)local_308._0_8_,
                        CONCAT62(local_2f8._M_allocated_capacity._2_6_,
                                 local_2f8._M_allocated_capacity._0_2_) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)local_390,local_258._0_8_);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) goto LAB_0035b527;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
      poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1528);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
      local_308._0_8_ = &local_2f8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_308,"Failed to evaluate `joints` in SkelAnimation Prim : {}","");
      fmt::format<tinyusdz::Path>((string *)local_258,(string *)local_308,local_3d8);
      poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,(char *)local_258._0_8_,
                           CONCAT44(local_258._12_4_,CONCAT22(local_258._10_2_,local_258._8_2_)));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_,CONCAT62(local_258._18_6_,local_258._16_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._0_8_ != &local_2f8) {
        operator_delete((void *)local_308._0_8_,
                        CONCAT62(local_2f8._M_allocated_capacity._2_6_,
                                 local_2f8._M_allocated_capacity._0_2_) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)local_390,local_258._0_8_);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
LAB_0035b527:
        operator_delete((void *)local_258._0_8_,CONCAT62(local_258._18_6_,local_258._16_2_) + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    ::std::ios_base::~ios_base(local_178);
    bVar16 = false;
    goto LAB_0035dfed;
  }
LAB_0035af74:
  local_2c8._0_8_ = (key_type *)0x0;
  local_2c8._8_8_ = (key_type *)0x0;
  local_2c8._16_8_ = (pointer)0x0;
  if ((((skelAnim->blendShapes)._attrib.has_value_ == false) &&
      ((skelAnim->blendShapes)._paths.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (skelAnim->blendShapes)._paths.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start)) &&
     (((skelAnim->blendShapes)._value_empty == false && ((skelAnim->blendShapes)._blocked != true)))
     ) {
LAB_0035b066:
    pTVar14 = local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_60 + 8);
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_0035d706:
      uVar8 = local_2c8._8_8_;
      if (local_2c8._8_8_ != local_2c8._0_8_) {
        local_2e8._0_8_ = local_308 + 8;
        local_308._8_2_ = _S_red;
        uStack_2fe = _S_red >> 0x10;
        local_2f8._M_allocated_capacity._0_2_ = 0;
        local_2f8._M_allocated_capacity._2_6_ = 0;
        local_2f8._M_local_buf[8] = false;
        local_2f8._M_local_buf[9] = (char)((ulong)local_2e8._0_8_ >> 8);
        local_2f8._10_6_ = (undefined6)((ulong)local_2e8._0_8_ >> 0x10);
        local_2e8[8] = 0;
        local_2e8._9_7_ = 0;
        if (((((skelAnim->blendShapeWeights)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               (skelAnim->blendShapeWeights)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start) &&
             ((skelAnim->blendShapeWeights)._attrib.has_value_ == false)) &&
            ((skelAnim->blendShapeWeights)._blocked == false)) &&
           ((skelAnim->blendShapeWeights)._value_empty == true)) {
          if (local_2c8._0_8_ != local_2c8._8_8_) {
            __k = (key_type *)local_2c8._0_8_;
            do {
              pmVar21 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                      *)local_308,__k);
              (pmVar21->static_value).contained = (storage_t<float>)0x3f800000;
              if ((pmVar21->static_value).has_value_ == false) {
                (pmVar21->static_value).has_value_ = true;
              }
              __k = __k + 1;
            } while (__k != (key_type *)uVar8);
          }
        }
        else {
          local_238[0x10] = 0;
          uStack_227 = 0;
          _Stack_220._M_color = _Stack_220._M_color & 0xffffff00;
          local_238._0_8_ = (pointer)0x0;
          local_238[8] = 0;
          local_238._9_7_ = 0;
          local_258._0_8_ = (char *)0x0;
          local_258._8_2_ = _S_red;
          local_258._10_2_ = _S_red >> 0x10;
          local_258._12_4_ = 0;
          local_258._16_2_ = 0;
          local_258._18_6_ = 0;
          local_258[0x18] = '\0';
          local_258[0x19] = '\0';
          bVar16 = TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                   ::get_value(&skelAnim->blendShapeWeights,
                               (Animatable<std::vector<float,_std::allocator<float>_>_> *)local_258)
          ;
          if (bVar16) {
            if ((bool)(undefined1)_Stack_220._M_color == true) {
              TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::update
                        ((TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> *)local_238)
              ;
            }
            if ((pointer)CONCAT71(local_238._9_7_,local_238[8]) == (pointer)local_238._0_8_) {
LAB_0035dbf8:
              if (local_258[0x18] != '\x01') {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                           ,0x5b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
                poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1678);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                pcVar28 = 
                "Internal error. `blendShapeWeights` attribute of SkelAnimation is invalid : {}";
                pcVar24 = "";
                goto LAB_0035ddb1;
              }
              fVar34 = 0.0;
              fVar36 = 0.0;
              local_3e8._M_allocated_capacity = 0;
              if (local_258[0x19] == '\0') {
                ::std::vector<float,_std::allocator<float>_>::operator=
                          ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffc08,
                           (vector<float,_std::allocator<float>_> *)local_258);
                if (-CONCAT44(fVar36,fVar34) >> 2 != (long)(local_2c8._8_8_ - local_2c8._0_8_) >> 5)
                {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                             ,0x5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3)
                  ;
                  poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1670)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                  local_2a8._0_8_ = (long)local_2a8 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2a8,
                             "blendShapeWeights.size {} must be equal to blendShapes.size {} : {}",
                             "");
                  local_3b0._M_dataplus._M_p = (pointer)(-CONCAT44(fVar36,fVar34) >> 2);
                  local_388.
                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)(local_2c8._8_8_ - local_2c8._0_8_) >> 5);
                  fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                            ((string *)local_368,(fmt *)local_2a8,&local_3b0,
                             (unsigned_long *)&local_388,(unsigned_long *)local_3d8,in_R9);
                  goto LAB_0035e1c3;
                }
                if (local_2c8._8_8_ != local_2c8._0_8_) {
                  lVar30 = 0;
                  uVar31 = 0;
                  do {
                    local_3d0 = (RenderSceneConverter *)
                                CONCAT44(local_3d0._4_4_,
                                         *(undefined4 *)(CONCAT44(fVar36,fVar34) + uVar31 * 4));
                    pmVar21 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                            *)local_308,(key_type *)(local_2c8._0_8_ + lVar30));
                    (pmVar21->static_value).contained = local_3d0._0_4_;
                    if ((pmVar21->static_value).has_value_ == false) {
                      (pmVar21->static_value).has_value_ = true;
                    }
                    uVar31 = uVar31 + 1;
                    lVar30 = lVar30 + 0x20;
                  } while (uVar31 < (ulong)((long)(local_2c8._8_8_ - local_2c8._0_8_) >> 5));
                }
                bVar13 = false;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                           ,0x5b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
                poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x166c);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                local_2a8._0_8_ = (long)local_2a8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2a8,
                           "Failed to get default value of `blendShapeWeights` attribute of SkelAnimation is invalid : {}"
                           ,"");
                fmt::format<tinyusdz::Path>((string *)local_368,(string *)local_2a8,local_3d8);
LAB_0035e1c3:
                poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e8,(char *)local_368._0_8_,
                                     CONCAT62(local_368._10_6_,local_368._8_2_));
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
                if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
                  operator_delete((void *)local_368._0_8_,
                                  CONCAT62(local_368._18_6_,local_368._16_2_) + 1);
                }
                if (local_2a8._0_8_ != (long)local_2a8 + 0x10) {
                  operator_delete((void *)local_2a8._0_8_,
                                  CONCAT62(local_2a8._18_6_,local_2a8._16_2_) + 1);
                }
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)&local_3d0->_err,local_368._0_8_);
                if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
                  operator_delete((void *)local_368._0_8_,
                                  CONCAT62(local_368._18_6_,local_368._16_2_) + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
                ::std::ios_base::~ios_base(local_178);
                bVar13 = true;
              }
              pvVar11 = (void *)CONCAT44(fVar36,fVar34);
              if (pvVar11 != (void *)0x0) {
                operator_delete(pvVar11,local_3e8._M_allocated_capacity - (long)pvVar11);
              }
            }
            else {
              local_2c8._24_8_ = skelAnim;
              if ((bool)(undefined1)_Stack_220._M_color == true) {
                TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::update
                          ((TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> *)
                           local_238);
              }
              pSVar12 = (pointer)CONCAT71(local_238._9_7_,local_238[8]);
              bVar16 = (pointer)local_238._0_8_ == pSVar12;
              if (bVar16) {
                bVar13 = false;
                skelAnim = (SkelAnimation *)local_2c8._24_8_;
              }
              else {
                in = (pointer)local_238._0_8_;
                do {
                  if (in->blocked == false) {
                    if ((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&(in->value).super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->
                               _M_allocated_capacity -
                              (long)(in->value).super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2 !=
                        (long)(local_2c8._8_8_ - local_2c8._0_8_) >> 5) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 ,0x5b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"():",3);
                      poVar20 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1e8,0x1659);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                      local_2a8._0_8_ = (long)local_2a8 + 0x10;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2a8,
                                 "Array length mismatch in SkelAnimation. timeCode {} blendShapeWeights.size {} must be equal to blendShapes.size {} : {}"
                                 ,"");
                      lVar30 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&(in->value).super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->
                               _M_allocated_capacity -
                               (long)(in->value).super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
                      local_3b0._M_dataplus._M_p =
                           (pointer)((long)(local_2c8._8_8_ - local_2c8._0_8_) >> 5);
                      in_R9 = local_3d8;
                      fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                                ((string *)local_368,(fmt *)local_2a8,(string *)in,
                                 (double *)&stack0xfffffffffffffc08,(unsigned_long *)&local_3b0,
                                 (unsigned_long *)local_3d8,
                                 (Path *)CONCAT44((float)(lVar30 >> 0x22),(float)(lVar30 >> 2)));
                      poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1e8,(char *)local_368._0_8_,
                                           CONCAT62(local_368._10_6_,local_368._8_2_));
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
                      if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
                        operator_delete((void *)local_368._0_8_,
                                        CONCAT62(local_368._18_6_,local_368._16_2_) + 1);
                      }
                      skelAnim = (SkelAnimation *)local_2c8._24_8_;
                      if (local_2a8._0_8_ != (long)local_2a8 + 0x10) {
                        operator_delete((void *)local_2a8._0_8_,
                                        CONCAT62(local_2a8._18_6_,local_2a8._16_2_) + 1);
                      }
                      ::std::__cxx11::stringbuf::str();
                      ::std::__cxx11::string::_M_append((char *)&local_3d0->_err,local_368._0_8_);
                      if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
                        operator_delete((void *)local_368._0_8_,
                                        CONCAT62(local_368._18_6_,local_368._16_2_) + 1);
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
                      ::std::ios_base::~ios_base(local_178);
                      bVar13 = true;
                      goto LAB_0035dbee;
                    }
                    p_Var22 = (_Base_ptr)
                              (in->value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    if ((_Base_ptr)
                        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&(in->value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish)->_M_allocated_capacity != p_Var22) {
                      lVar30 = 0;
                      uVar31 = 0;
                      do {
                        local_1e8._4_4_ = (&p_Var22->_M_color)[uVar31];
                        local_1e8._0_4_ = (float)(double)((_Alloc_hider *)&in->t)->_M_p;
                        pmVar21 = ::std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                                *)local_308,(key_type *)(local_2c8._0_8_ + lVar30));
                        __position_00._M_current =
                             (pmVar21->samples).
                             super__Vector_base<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        if (__position_00._M_current ==
                            (pmVar21->samples).
                            super__Vector_base<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          ::std::
                          vector<tinyusdz::tydra::AnimationSample<float>,std::allocator<tinyusdz::tydra::AnimationSample<float>>>
                          ::_M_realloc_insert<tinyusdz::tydra::AnimationSample<float>const&>
                                    ((vector<tinyusdz::tydra::AnimationSample<float>,std::allocator<tinyusdz::tydra::AnimationSample<float>>>
                                      *)&pmVar21->samples,__position_00,
                                     (AnimationSample<float> *)local_1e8);
                        }
                        else {
                          (__position_00._M_current)->t = (float)local_1e8._0_4_;
                          (__position_00._M_current)->value = (float)local_1e8._4_4_;
                          ppAVar2 = &(pmVar21->samples).
                                     super__Vector_base<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          *ppAVar2 = *ppAVar2 + 1;
                        }
                        uVar31 = uVar31 + 1;
                        p_Var22 = (_Base_ptr)
                                  (in->value).super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        lVar30 = lVar30 + 0x20;
                      } while (uVar31 < (ulong)((long)(((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)&(in->value).
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_allocated_capacity - (long)p_Var22) >> 2));
                    }
                  }
                  in = in + 1;
                  bVar16 = in == pSVar12;
                } while (!bVar16);
                bVar13 = false;
                skelAnim = (SkelAnimation *)local_2c8._24_8_;
              }
LAB_0035dbee:
              if (bVar16) goto LAB_0035dbf8;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                       ,0x5b);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
            poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x164f);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
            pcVar28 = 
            "Failed to get `blendShapeWeights` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
            ;
            pcVar24 = "";
LAB_0035ddb1:
            local_2a8._0_8_ = (long)local_2a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,pcVar28,pcVar24);
            fmt::format<tinyusdz::Path>((string *)local_368,(string *)local_2a8,local_3d8);
            poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,(char *)local_368._0_8_,
                                 CONCAT62(local_368._10_6_,local_368._8_2_));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              CONCAT62(local_368._18_6_,local_368._16_2_) + 1);
            }
            if (local_2a8._0_8_ != (long)local_2a8 + 0x10) {
              operator_delete((void *)local_2a8._0_8_,
                              CONCAT62(local_2a8._18_6_,local_2a8._16_2_) + 1);
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)&local_3d0->_err,local_368._0_8_);
            if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_,
                              CONCAT62(local_368._18_6_,local_368._16_2_) + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            ::std::ios_base::~ios_base(local_178);
            bVar13 = true;
          }
          ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
          ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
                     *)local_238);
          if ((char *)local_258._0_8_ != (char *)0x0) {
            operator_delete((void *)local_258._0_8_,
                            CONCAT62(local_258._18_6_,local_258._16_2_) - local_258._0_8_);
          }
          if (bVar13) {
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                        *)local_308,
                       (_Link_type)
                       CONCAT62(local_2f8._M_allocated_capacity._2_6_,
                                local_2f8._M_allocated_capacity._0_2_));
            goto LAB_0035dee1;
          }
        }
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
        ::operator=(&local_260->blendshape_weights_map,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                     *)local_308);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                    *)local_308,
                   (_Link_type)
                   CONCAT62(local_2f8._M_allocated_capacity._2_6_,
                            local_2f8._M_allocated_capacity._0_2_));
      }
      Path::full_path_name_abi_cxx11_((string *)local_1e8,local_3d8);
      ::std::__cxx11::string::operator=((string *)&local_260->abs_path,(string *)local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
      }
      pAVar15 = local_260;
      ::std::__cxx11::string::_M_assign((string *)local_260);
      nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
                ((value_type *)local_1e8,
                 (optional<std::__cxx11::string> *)&(skelAnim->meta).displayName,
                 (char (*) [1])0x6208e3);
      ::std::__cxx11::string::operator=((string *)&pAVar15->display_name,(string *)local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
      }
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
      ::operator=(&local_260->channels_map,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                   *)&local_60);
      bVar16 = true;
    }
    else {
      local_238._0_8_ = local_258 + 8;
      local_258._8_2_ = _S_red;
      local_258._10_2_ = _S_red >> 0x10;
      local_258._16_2_ = 0;
      local_258._18_6_ = 0;
      local_258[0x18] = (undefined1)local_238._0_8_;
      local_258[0x19] = (undefined1)((ulong)local_238._0_8_ >> 8);
      local_258._26_6_ = (undefined6)((ulong)local_238._0_8_ >> 0x10);
      local_238[8] = 0;
      local_238._9_7_ = 0;
      _Stack_220._M_left = &_Stack_220;
      _Stack_220._M_color = _S_red;
      _Stack_220._M_parent = (_Base_ptr)0x0;
      local_200 = 0;
      psVar25 = &(local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start)->str_;
      _Stack_220._M_right = _Stack_220._M_left;
      do {
        uVar27 = CONCAT71(local_238._9_7_,local_238[8]);
        if (uVar27 != local_200) {
          uVar27 = 0;
        }
        StringAndIdMap::add((StringAndIdMap *)local_258,psVar25,uVar27);
        psVar25 = psVar25 + 1;
      } while (psVar25 != &pTVar14->str_);
      local_2e8[0x10] = '\0';
      local_2e8._17_8_ = 0;
      local_2e8._0_8_ = (pointer)0x0;
      local_2e8[8] = 0;
      local_2e8._9_7_ = 0;
      local_308._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_308._8_2_ = _S_red;
      uStack_2fe = _S_red >> 0x10;
      uStack_2fc = 0;
      local_2f8._M_allocated_capacity._0_2_ = 0;
      local_2f8._M_allocated_capacity._2_6_ = 0;
      local_2f8._M_local_buf[8] = false;
      local_2f8._M_local_buf[9] = false;
      bVar16 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
               ::get_value(&skelAnim->translations,
                           (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                            *)local_308);
      if (bVar16) {
        local_348[0x10] = '\0';
        local_348._17_8_ = 0;
        local_348._0_8_ = (pointer)0x0;
        local_348[8] = 0;
        local_348._9_7_ = 0;
        local_368._0_8_ = (pointer)0x0;
        local_368._8_2_ = 0;
        local_368._10_6_ = 0;
        local_368._16_2_ = 0;
        local_368._18_6_ = 0;
        local_368[0x18] = false;
        local_368[0x19] = false;
        bVar16 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                 ::get_value(&skelAnim->rotations,
                             (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                              *)local_368);
        if (!bVar16) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
          poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1559);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
          _Var35._M_p = (pointer)&local_3e8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffc08,
                     "Failed to get `rotations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                     ,"");
          fmt::format<tinyusdz::Path>
                    ((string *)local_2a8,(string *)&stack0xfffffffffffffc08,local_3d8);
          poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,(char *)local_2a8._0_8_,
                               CONCAT62(local_2a8._10_6_,local_2a8._8_2_));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
          if (local_2a8._0_8_ != (long)local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_,CONCAT62(local_2a8._18_6_,local_2a8._16_2_) + 1)
            ;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var35._M_p != &local_3e8) {
            operator_delete(_Var35._M_p,local_3e8._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)&local_3d0->_err,local_2a8._0_8_);
          if (local_2a8._0_8_ != (long)local_2a8 + 0x10) {
            operator_delete((void *)local_2a8._0_8_,CONCAT62(local_2a8._18_6_,local_2a8._16_2_) + 1)
            ;
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          ::std::ios_base::~ios_base(local_178);
          ::std::
          vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
          ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                     *)local_348);
          if ((pointer)local_368._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_368._0_8_,
                            CONCAT62(local_368._18_6_,local_368._16_2_) - local_368._0_8_);
          }
          goto LAB_0035bccb;
        }
        local_288._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_288._17_8_ = 0;
        local_288._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_288._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_288._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        local_2a8[0] = false;
        local_2a8._1_3_ = 0;
        local_2a8._4_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
        local_2a8._8_2_ = 0;
        local_2a8._10_6_ = 0;
        local_2a8._16_2_ = 0;
        local_2a8._18_6_ = 0;
        local_2a8[0x18] = false;
        local_2a8[0x19] = false;
        bVar16 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                 ::get_value(&skelAnim->scales,
                             (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                              *)local_2a8);
        local_2c8._24_8_ = skelAnim;
        if (bVar16) {
          if ((bool)local_2e8[0x18] == true) {
            TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::update((TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                      *)local_2e8);
          }
          if ((pointer)CONCAT71(local_2e8._9_7_,local_2e8[8]) != (pointer)local_2e8._0_8_) {
            if ((bool)local_2e8[0x18] == true) {
              TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
              ::update((TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                        *)local_2e8);
            }
            if ((pointer)local_2e8._0_8_ == (pointer)CONCAT71(local_2e8._9_7_,local_2e8[8])) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1571);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b0,
                         "`translations` timeSamples in SkelAnimation is empty : {}","");
              fmt::format<tinyusdz::Path>((string *)&stack0xfffffffffffffc08,&local_3b0,local_3d8);
              poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e8,
                                   (char *)CONCAT44(in_stack_fffffffffffffc0c,
                                                    in_stack_fffffffffffffc08),
                                   CONCAT44(fStack_3ec,fStack_3f0));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) != &local_3e8) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                                local_3e8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append
                        ((char *)&local_3d0->_err,
                         CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
              paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08);
              if (paVar29 != &local_3e8) {
LAB_0035c0b7:
                operator_delete(paVar29,local_3e8._M_allocated_capacity + 1);
              }
LAB_0035c0c4:
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
              ::std::ios_base::~ios_base(local_178);
              bVar16 = true;
              bVar13 = false;
            }
            else {
              if ((bool)local_2e8[0x18] == true) {
                TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                ::update((TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                          *)local_2e8);
              }
              local_390 = (pointer)CONCAT71(local_2e8._9_7_,local_2e8[8]);
              bVar13 = true;
              if ((pointer)local_2e8._0_8_ == local_390) {
                bVar16 = false;
              }
              else {
                pSVar26 = (pointer)local_2e8._0_8_;
                do {
                  if (pSVar26->blocked == false) {
                    if (((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)&(pSVar26->value).
                                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->
                                _M_allocated_capacity -
                               (long)(pSVar26->value).
                                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                        -0x5555555555555555 -
                        ((long)local_3c8.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_3c8.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 ,0x5b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"():",3);
                      poVar20 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1e8,0x1578);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_3b0,
                                 "Array length mismatch in SkelAnimation. timeCode {} translations.size {} must be equal to joints.size {} : {}"
                                 ,"");
                      local_388.
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)(((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)&(pSVar26->value).
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                             _M_allocated_capacity -
                                            (long)(pSVar26->value).
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                    -0x5555555555555555);
                      local_328._M_dataplus._M_p =
                           (pointer)((long)local_3c8.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_3c8.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 5);
                      in_R9 = local_3d8;
                      fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                                ((string *)&stack0xfffffffffffffc08,(fmt *)&local_3b0,
                                 (string *)pSVar26,(double *)&local_388,(unsigned_long *)&local_328,
                                 (unsigned_long *)local_3d8,
                                 (Path *)CONCAT44(in_stack_fffffffffffffc0c,
                                                  in_stack_fffffffffffffc08));
                      poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1e8,
                                           (char *)CONCAT44(in_stack_fffffffffffffc0c,
                                                            in_stack_fffffffffffffc08),
                                           CONCAT44(fStack_3ec,fStack_3f0));
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) !=
                          &local_3e8) {
                        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT44(in_stack_fffffffffffffc0c,
                                                    in_stack_fffffffffffffc08),
                                        local_3e8._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                        operator_delete(local_3b0._M_dataplus._M_p,
                                        local_3b0.field_2._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::stringbuf::str();
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_3d0->_err,
                                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
                      paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08);
                      if (paVar29 == &local_3e8) goto LAB_0035c0c4;
                      goto LAB_0035c0b7;
                    }
                    if ((pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)&(pSVar26->value).
                                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->
                                 _M_allocated_capacity !=
                        (pSVar26->value).
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      lVar30 = 0;
                      pcVar32 = (pointer)0x0;
                      do {
                        in_stack_fffffffffffffc08 =
                             (float)(double)((_Alloc_hider *)&pSVar26->t)->_M_p;
                        paVar7 = (pSVar26->value).
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        fStack_3ec = *(float *)((long)paVar7->_M_elems + lVar30 + 8);
                        uVar8 = *(undefined8 *)((long)paVar7->_M_elems + lVar30);
                        in_stack_fffffffffffffc0c = (float)uVar8;
                        fStack_3f0 = (float)((ulong)uVar8 >> 0x20);
                        local_3b0._M_dataplus._M_p = pcVar32;
                        pmVar17 = ::std::
                                  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::at((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)local_258,(key_type *)&local_3b0);
                        pcVar9 = (pmVar17->_M_dataplus)._M_p;
                        local_1e8._0_8_ = local_1d8;
                        ::std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_1e8,pcVar9,pcVar9 + pmVar17->_M_string_length);
                        pmVar18 = ::std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                                *)&local_60,(key_type *)local_1e8);
                        local_3b0._M_dataplus._M_p._0_4_ = 1;
                        pmVar19 = ::std::
                                  map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                  ::operator[](pmVar18,(key_type *)&local_3b0);
                        iVar10._M_current =
                             (pmVar19->translations).samples.
                             super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        if ((pmVar19->translations).samples.
                            super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start == iVar10._M_current) {
                          pmVar19->type = Translation;
                        }
                        if (iVar10._M_current ==
                            (pmVar19->translations).samples.
                            super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          ::std::
                          vector<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>>>
                          ::
                          _M_realloc_insert<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>const&>
                                    ((vector<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>>>
                                      *)&(pmVar19->translations).samples,iVar10,
                                     (AnimationSample<std::array<float,_3UL>_> *)
                                     &stack0xfffffffffffffc08);
                        }
                        else {
                          (iVar10._M_current)->t = in_stack_fffffffffffffc08;
                          ((iVar10._M_current)->value)._M_elems[0] = in_stack_fffffffffffffc0c;
                          ((iVar10._M_current)->value)._M_elems[1] = fStack_3f0;
                          ((iVar10._M_current)->value)._M_elems[2] = fStack_3ec;
                          ppAVar3 = &(pmVar19->translations).samples.
                                     super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          *ppAVar3 = *ppAVar3 + 1;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1e8._0_8_ != local_1d8) {
                          operator_delete((void *)local_1e8._0_8_,
                                          local_1d8[0]._M_allocated_capacity + 1);
                        }
                        pcVar32 = pcVar32 + 1;
                        lVar30 = lVar30 + 0xc;
                      } while (pcVar32 < (pointer)(((long)(((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)&(pSVar26->value).
                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_allocated_capacity -
                                                  (long)(pSVar26->value).
                                                                                                                
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                                  -0x5555555555555555));
                    }
                  }
                  pSVar26 = pSVar26 + 1;
                } while (pSVar26 != local_390);
                bVar16 = false;
                bVar13 = true;
              }
            }
            if (!bVar13) goto LAB_0035d65d;
          }
          if ((bool)local_348[0x18] == true) {
            TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::update((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                      *)local_348);
          }
          if ((pointer)CONCAT71(local_348._9_7_,local_348[8]) != (pointer)local_348._0_8_) {
            if ((bool)local_348[0x18] == true) {
              TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
              ::update((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        *)local_348);
            }
            local_390 = (pointer)CONCAT71(local_348._9_7_,local_348[8]);
            bVar33 = (pointer)local_348._0_8_ == local_390;
            if ((bool)bVar33) {
              bVar16 = false;
            }
            else {
              pSVar26 = (pointer)local_348._0_8_;
              do {
                if (pSVar26->blocked == false) {
                  if ((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&(pSVar26->value).
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->_M_allocated_capacity
                            - (long)(pSVar26->value).
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4 !=
                      (long)local_3c8.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_3c8.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5) {
                    local_390 = (pointer)CONCAT71(local_390._1_7_,bVar33);
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               ,0x5b);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"():",3);
                    poVar20 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1e8,0x1592);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3b0,
                               "Array length mismatch in SkelAnimation. timeCode {} rotations.size {} must be equal to joints.size {} : {}"
                               ,"");
                    local_388.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                            *)&(pSVar26->value).
                                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish)->
                                          _M_allocated_capacity -
                                         (long)(pSVar26->value).
                                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
                    local_328._M_dataplus._M_p =
                         (pointer)((long)local_3c8.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_3c8.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
                    in_R9 = local_3d8;
                    fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                              ((string *)&stack0xfffffffffffffc08,(fmt *)&local_3b0,
                               (string *)pSVar26,(double *)&local_388,(unsigned_long *)&local_328,
                               (unsigned_long *)local_3d8,
                               (Path *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08)
                              );
                    poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1e8,
                                         (char *)CONCAT44(in_stack_fffffffffffffc0c,
                                                          in_stack_fffffffffffffc08),
                                         CONCAT44(fStack_3ec,fStack_3f0));
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) !=
                        &local_3e8) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT44(in_stack_fffffffffffffc0c,
                                                  in_stack_fffffffffffffc08),
                                      local_3e8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                      operator_delete(local_3b0._M_dataplus._M_p,
                                      local_3b0.field_2._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_3d0->_err,
                               CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) !=
                        &local_3e8) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT44(in_stack_fffffffffffffc0c,
                                                  in_stack_fffffffffffffc08),
                                      local_3e8._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
                    ::std::ios_base::~ios_base(local_178);
                    bVar16 = true;
                    bVar33 = (byte)local_390;
                    goto LAB_0035c4cb;
                  }
                  if ((pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&(pSVar26->value).
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->
                               _M_allocated_capacity !=
                      (pSVar26->value).
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    lVar30 = 0xc;
                    pcVar32 = (pointer)0x0;
                    do {
                      in_stack_fffffffffffffc08 = (float)(double)((_Alloc_hider *)&pSVar26->t)->_M_p
                      ;
                      paVar7 = (pSVar26->value).
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      in_stack_fffffffffffffc0c = *(float *)((long)paVar7[-1]._M_elems + lVar30);
                      fStack_3f0 = *(float *)((long)paVar7->_M_elems + lVar30 + -8);
                      fStack_3ec = *(float *)((long)paVar7->_M_elems + lVar30 + -4);
                      local_3e8._M_allocated_capacity._0_4_ =
                           *(undefined4 *)((long)paVar7->_M_elems + lVar30);
                      local_3b0._M_dataplus._M_p = pcVar32;
                      pmVar17 = ::std::
                                map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::at((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)local_258,(key_type *)&local_3b0);
                      pcVar9 = (pmVar17->_M_dataplus)._M_p;
                      local_1e8._0_8_ = local_1d8;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)local_1e8,pcVar9,pcVar9 + pmVar17->_M_string_length);
                      pmVar18 = ::std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                              *)&local_60,(key_type *)local_1e8);
                      local_3b0._M_dataplus._M_p._0_4_ = 2;
                      pmVar19 = ::std::
                                map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                ::operator[](pmVar18,(key_type *)&local_3b0);
                      __position._M_current =
                           (pmVar19->rotations).samples.
                           super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if ((pmVar19->rotations).samples.
                          super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == __position._M_current) {
                        pmVar19->type = Rotation;
                      }
                      if (__position._M_current ==
                          (pmVar19->rotations).samples.
                          super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        ::std::
                        vector<tinyusdz::tydra::AnimationSample<std::array<float,4ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,4ul>>>>
                        ::
                        _M_realloc_insert<tinyusdz::tydra::AnimationSample<std::array<float,4ul>>const&>
                                  ((vector<tinyusdz::tydra::AnimationSample<std::array<float,4ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,4ul>>>>
                                    *)&(pmVar19->rotations).samples,__position,
                                   (AnimationSample<std::array<float,_4UL>_> *)
                                   &stack0xfffffffffffffc08);
                      }
                      else {
                        ((__position._M_current)->value)._M_elems[3] =
                             (float)local_3e8._M_allocated_capacity._0_4_;
                        (__position._M_current)->t = in_stack_fffffffffffffc08;
                        ((__position._M_current)->value)._M_elems[0] = in_stack_fffffffffffffc0c;
                        ((__position._M_current)->value)._M_elems[1] = fStack_3f0;
                        ((__position._M_current)->value)._M_elems[2] = fStack_3ec;
                        ppAVar4 = &(pmVar19->rotations).samples.
                                   super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppAVar4 = *ppAVar4 + 1;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8._0_8_ != local_1d8) {
                        operator_delete((void *)local_1e8._0_8_,
                                        local_1d8[0]._M_allocated_capacity + 1);
                      }
                      pcVar32 = pcVar32 + 1;
                      lVar30 = lVar30 + 0x10;
                    } while (pcVar32 < (pointer)((long)(((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)&(pSVar26->value).
                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_allocated_capacity -
                                                  (long)(pSVar26->value).
                                                                                                                
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
                  }
                }
                pSVar26 = pSVar26 + 1;
                bVar33 = pSVar26 == local_390;
              } while (!(bool)bVar33);
              bVar16 = false;
            }
LAB_0035c4cb:
            if ((bVar33 & 1) == 0) goto LAB_0035d65d;
          }
          if (local_288._dirty == true) {
            TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
            ::update(&local_288);
          }
          if ((pointer)CONCAT71(local_288._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                local_288._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish._0_1_) !=
              (pointer)local_288._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
            if (local_288._dirty == true) {
              TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
              ::update(&local_288);
            }
            local_390 = (pointer)CONCAT71(local_288._samples.
                                          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                          local_288._samples.
                                          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_finish._0_1_);
            bVar33 = (pointer)local_288._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start == local_390;
            if ((bool)bVar33) {
              bVar16 = false;
            }
            else {
              pSVar26 = (pointer)local_288._samples.
                                 super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
              do {
                if (pSVar26->blocked == false) {
                  if (((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)&(pSVar26->value).
                                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->
                              _M_allocated_capacity -
                             (long)(pSVar26->value).
                                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 1) *
                      -0x5555555555555555 -
                      ((long)local_3c8.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_3c8.
                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
                    local_390 = (pointer)CONCAT71(local_390._1_7_,bVar33);
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               ,0x5b);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,"():",3);
                    poVar20 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1e8,0x15ae);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3b0,
                               "Array length mismatch in SkelAnimation. timeCode {} scales.size {} must be equal to joints.size {} : {}"
                               ,"");
                    local_388.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)&(pSVar26->value).
                                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish)->
                                           _M_allocated_capacity -
                                          (long)(pSVar26->value).
                                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 1) *
                                  -0x5555555555555555);
                    local_328._M_dataplus._M_p =
                         (pointer)((long)local_3c8.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_3c8.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
                    in_R9 = local_3d8;
                    fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                              ((string *)&stack0xfffffffffffffc08,(fmt *)&local_3b0,
                               (string *)pSVar26,(double *)&local_388,(unsigned_long *)&local_328,
                               (unsigned_long *)local_3d8,
                               (Path *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08)
                              );
                    poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1e8,
                                         (char *)CONCAT44(in_stack_fffffffffffffc0c,
                                                          in_stack_fffffffffffffc08),
                                         CONCAT44(fStack_3ec,fStack_3f0));
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) !=
                        &local_3e8) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT44(in_stack_fffffffffffffc0c,
                                                  in_stack_fffffffffffffc08),
                                      local_3e8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                      operator_delete(local_3b0._M_dataplus._M_p,
                                      local_3b0.field_2._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_3d0->_err,
                               CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) !=
                        &local_3e8) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT44(in_stack_fffffffffffffc0c,
                                                  in_stack_fffffffffffffc08),
                                      local_3e8._M_allocated_capacity + 1);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
                    ::std::ios_base::~ios_base(local_178);
                    bVar16 = true;
                    bVar33 = (byte)local_390;
                    goto LAB_0035ca74;
                  }
                  if ((pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&(pSVar26->value).
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->
                               _M_allocated_capacity !=
                      (pSVar26->value).
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    lVar30 = 0;
                    pcVar32 = (pointer)0x0;
                    do {
                      in_stack_fffffffffffffc08 = (float)(double)((_Alloc_hider *)&pSVar26->t)->_M_p
                      ;
                      in_stack_fffffffffffffc0c =
                           tinyusdz::value::half_to_float
                                     ((half)*(uint16_t *)
                                             ((long)((pSVar26->value).
                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar30));
                      fStack_3f0 = tinyusdz::value::half_to_float
                                             ((half)*(uint16_t *)
                                                     ((long)((pSVar26->value).
                                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar30 + 2));
                      fStack_3ec = tinyusdz::value::half_to_float
                                             ((half)*(uint16_t *)
                                                     ((long)((pSVar26->value).
                                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar30 + 4));
                      local_3b0._M_dataplus._M_p = pcVar32;
                      pmVar17 = ::std::
                                map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::at((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)local_258,(key_type *)&local_3b0);
                      pcVar9 = (pmVar17->_M_dataplus)._M_p;
                      local_1e8._0_8_ = local_1d8;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)local_1e8,pcVar9,pcVar9 + pmVar17->_M_string_length);
                      pmVar18 = ::std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                              *)&local_60,(key_type *)local_1e8);
                      local_3b0._M_dataplus._M_p._0_4_ = 3;
                      pmVar19 = ::std::
                                map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                ::operator[](pmVar18,(key_type *)&local_3b0);
                      iVar10._M_current =
                           (pmVar19->scales).samples.
                           super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if ((pmVar19->scales).samples.
                          super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == iVar10._M_current) {
                        pmVar19->type = Scale;
                      }
                      if (iVar10._M_current ==
                          (pmVar19->scales).samples.
                          super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        ::std::
                        vector<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>>>
                        ::
                        _M_realloc_insert<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>const&>
                                  ((vector<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>,std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,3ul>>>>
                                    *)&(pmVar19->scales).samples,iVar10,
                                   (AnimationSample<std::array<float,_3UL>_> *)
                                   &stack0xfffffffffffffc08);
                      }
                      else {
                        (iVar10._M_current)->t = in_stack_fffffffffffffc08;
                        ((iVar10._M_current)->value)._M_elems[0] = in_stack_fffffffffffffc0c;
                        ((iVar10._M_current)->value)._M_elems[1] = fStack_3f0;
                        ((iVar10._M_current)->value)._M_elems[2] = fStack_3ec;
                        ppAVar3 = &(pmVar19->scales).samples.
                                   super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppAVar3 = *ppAVar3 + 1;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8._0_8_ != local_1d8) {
                        operator_delete((void *)local_1e8._0_8_,
                                        local_1d8[0]._M_allocated_capacity + 1);
                      }
                      pcVar32 = pcVar32 + 1;
                      lVar30 = lVar30 + 6;
                    } while (pcVar32 < (pointer)(((long)(((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)&(pSVar26->value).
                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  _M_allocated_capacity -
                                                  (long)(pSVar26->value).
                                                                                                                
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 1) *
                                                -0x5555555555555555));
                  }
                }
                pSVar26 = pSVar26 + 1;
                bVar33 = pSVar26 == local_390;
              } while (!(bool)bVar33);
              bVar16 = false;
            }
LAB_0035ca74:
            if ((bVar33 & 1) == 0) goto LAB_0035d65d;
          }
          if ((bool)local_2f8._M_local_buf[8] == true) {
            local_388.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_388.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_388.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((bool)local_2f8._M_local_buf[9] == false) {
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              operator=(&local_388,
                        (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                        local_308);
              if (((long)local_388.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_388.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
                  ((long)local_3c8.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3c8.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 5) == 0) {
                if (local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar30 = 0;
                  uVar31 = 0;
                  do {
                    in_stack_fffffffffffffc0c = (float)(uVar31 >> 0x20);
                    pmVar17 = ::std::
                              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::at((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_258,(key_type *)&stack0xfffffffffffffc08);
                    pcVar32 = (pmVar17->_M_dataplus)._M_p;
                    local_1e8._0_8_ = local_1d8;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)local_1e8,pcVar32,pcVar32 + pmVar17->_M_string_length);
                    pmVar18 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&local_60,(key_type *)local_1e8);
                    in_stack_fffffffffffffc08 = 1.4013e-45;
                    pmVar19 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar18,(key_type *)&stack0xfffffffffffffc08);
                    puVar23 = (undefined8 *)
                              ((long)(local_388.
                                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30)
                    ;
                    psVar1 = &(pmVar19->translations).static_value.contained;
                    if ((pmVar19->translations).static_value.has_value_ == true) {
                      *(undefined4 *)((long)&(pmVar19->translations).static_value.contained + 8) =
                           *(undefined4 *)(puVar23 + 1);
                      *(undefined8 *)psVar1 = *puVar23;
                    }
                    else {
                      uVar8 = *puVar23;
                      *(undefined4 *)((long)&(pmVar19->translations).static_value.contained + 8) =
                           *(undefined4 *)(puVar23 + 1);
                      *(undefined8 *)psVar1 = uVar8;
                      (pmVar19->translations).static_value.has_value_ = true;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._0_8_ != local_1d8) {
                      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1
                                     );
                    }
                    uVar31 = uVar31 + 1;
                    lVar30 = lVar30 + 0xc;
                  } while (uVar31 < (ulong)((long)local_3c8.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_3c8.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                }
                if (local_388.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_388.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_388.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_388.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_0035ccd3;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15d0);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b0,
                         "Array length mismatch in SkelAnimation. translations.default.size {} must be equal to joints.size {} : {}"
                         ,"");
              local_328._M_dataplus._M_p =
                   (pointer)(((long)local_388.
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_388.
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                            -0x5555555555555555);
              local_1f0 = (undefined1  [8])
                          ((long)local_3c8.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_3c8.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
              fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                        ((string *)&stack0xfffffffffffffc08,(fmt *)&local_3b0,&local_328,
                         (unsigned_long *)local_1f0,(unsigned_long *)local_3d8,in_R9);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15cd);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b0,
                         "Failed to get `translations` attribute in SkelAnimation: {}","");
              fmt::format<tinyusdz::Path>((string *)&stack0xfffffffffffffc08,&local_3b0,local_3d8);
            }
            poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,
                                 (char *)CONCAT44(in_stack_fffffffffffffc0c,
                                                  in_stack_fffffffffffffc08),
                                 CONCAT44(fStack_3ec,fStack_3f0));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) != &local_3e8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                              local_3e8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
              operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append
                      ((char *)&local_3d0->_err,
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) != &local_3e8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                              local_3e8._M_allocated_capacity + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            ::std::ios_base::~ios_base(local_178);
          }
          else {
LAB_0035ccd3:
            if ((bool)local_368[0x18] != true) {
LAB_0035cf36:
              bVar16 = false;
              if ((bool)local_2a8[0x18] == true) {
                local_388.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_388.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_388.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_328.field_2._0_8_ = 0;
                local_328._M_dataplus._M_p = (pointer)0x0;
                local_328._M_string_length = 0;
                if ((bool)local_2a8[0x19] != false) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                             ,0x5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3)
                  ;
                  poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15fa)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                  pcVar28 = "Failed to get `scales` attribute in SkelAnimation: {}";
                  pcVar24 = "";
                  goto LAB_0035d023;
                }
                ::std::
                vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                ::operator=((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                             *)&local_328,
                            (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                             *)local_2a8);
                if (((long)(local_328._M_string_length - (long)local_328._M_dataplus._M_p) >> 1) *
                    -0x5555555555555555 -
                    ((long)local_3c8.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_3c8.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 5) != 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                             ,0x5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3)
                  ;
                  poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15fd)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
                  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3b0,
                             "Array length mismatch in SkelAnimation. scale.default.size {} must be equal to joints.size {} : {}"
                             ,"");
                  local_1f0 = (undefined1  [8])
                              (((long)(local_328._M_string_length - (long)local_328._M_dataplus._M_p
                                      ) >> 1) * -0x5555555555555555);
                  goto LAB_0035d52d;
                }
                ::std::
                transform<__gnu_cxx::__normal_iterator<std::array<tinyusdz::value::half,3ul>*,std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>,std::back_insert_iterator<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,tinyusdz::tydra::RenderSceneConverter::ConvertSkelAnimation(tinyusdz::tydra::RenderSceneConverterEnv_const&,tinyusdz::Path_const&,tinyusdz::SkelAnimation_const&,tinyusdz::tydra::Animation*)::__1>
                          (local_328._M_dataplus._M_p,local_328._M_string_length,&local_388);
                if (local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar30 = 0;
                  uVar27 = 0;
                  do {
                    StringAndIdMap::at_abi_cxx11_
                              ((string *)local_1e8,(StringAndIdMap *)local_258,uVar27);
                    pmVar18 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&local_60,(string *)local_1e8);
                    pmVar19 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar18,(key_type *)&stack0xfffffffffffffc08);
                    puVar23 = (undefined8 *)
                              ((long)(local_388.
                                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30)
                    ;
                    psVar1 = &(pmVar19->scales).static_value.contained;
                    if ((pmVar19->scales).static_value.has_value_ == true) {
                      *(undefined4 *)((long)&(pmVar19->scales).static_value.contained + 8) =
                           *(undefined4 *)(puVar23 + 1);
                      *(undefined8 *)psVar1 = *puVar23;
                    }
                    else {
                      uVar8 = *puVar23;
                      *(undefined4 *)((long)&(pmVar19->scales).static_value.contained + 8) =
                           *(undefined4 *)(puVar23 + 1);
                      *(undefined8 *)psVar1 = uVar8;
                      (pmVar19->scales).static_value.has_value_ = true;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._0_8_ != local_1d8) {
                      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1
                                     );
                    }
                    uVar27 = uVar27 + 1;
                    lVar30 = lVar30 + 0xc;
                  } while (uVar27 < (ulong)((long)local_3c8.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_3c8.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                }
                if (local_328._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(local_328._M_dataplus._M_p,
                                  local_328.field_2._0_8_ - (long)local_328._M_dataplus._M_p);
                }
                if (local_388.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_388.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_388.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_388.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                bVar16 = false;
              }
              goto LAB_0035d65d;
            }
            local_388.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_388.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_388.
            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_328.field_2._0_8_ = 0;
            local_328._M_dataplus._M_p = (pointer)0x0;
            local_328._M_string_length = 0;
            if ((bool)local_368[0x19] == false) {
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
              operator=((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                        &local_328,
                        (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                        local_368);
              if ((long)(local_328._M_string_length - (long)local_328._M_dataplus._M_p) >> 4 ==
                  (long)local_3c8.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_3c8.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 5) {
                ::std::
                transform<__gnu_cxx::__normal_iterator<tinyusdz::value::quatf*,std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>,std::back_insert_iterator<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>,tinyusdz::tydra::RenderSceneConverter::ConvertSkelAnimation(tinyusdz::tydra::RenderSceneConverterEnv_const&,tinyusdz::Path_const&,tinyusdz::SkelAnimation_const&,tinyusdz::tydra::Animation*)::__0>
                          (local_328._M_dataplus._M_p,local_328._M_string_length,&local_388);
                if (local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_3c8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  lVar30 = 0;
                  uVar31 = 0;
                  do {
                    in_stack_fffffffffffffc0c = (float)(uVar31 >> 0x20);
                    pmVar17 = ::std::
                              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::at((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_258,(key_type *)&stack0xfffffffffffffc08);
                    pcVar32 = (pmVar17->_M_dataplus)._M_p;
                    local_1e8._0_8_ = local_1d8;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)local_1e8,pcVar32,pcVar32 + pmVar17->_M_string_length);
                    pmVar18 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&local_60,(key_type *)local_1e8);
                    in_stack_fffffffffffffc08 = 2.8026e-45;
                    pmVar19 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar18,(key_type *)&stack0xfffffffffffffc08);
                    puVar23 = (undefined8 *)
                              ((long)(local_388.
                                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30)
                    ;
                    psVar5 = &(pmVar19->rotations).static_value.contained;
                    if ((pmVar19->rotations).static_value.has_value_ == true) {
                      uVar8 = puVar23[1];
                      *(undefined8 *)psVar5 = *puVar23;
                      *(undefined8 *)((long)&(pmVar19->rotations).static_value.contained + 8) =
                           uVar8;
                    }
                    else {
                      uVar8 = puVar23[1];
                      *(undefined8 *)psVar5 = *puVar23;
                      *(undefined8 *)((long)&(pmVar19->rotations).static_value.contained + 8) =
                           uVar8;
                      (pmVar19->rotations).static_value.has_value_ = true;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._0_8_ != local_1d8) {
                      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1
                                     );
                    }
                    uVar31 = uVar31 + 1;
                    lVar30 = lVar30 + 0x10;
                  } while (uVar31 < (ulong)((long)local_3c8.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_3c8.
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                }
                if (local_328._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(local_328._M_dataplus._M_p,
                                  local_328.field_2._0_8_ - (long)local_328._M_dataplus._M_p);
                }
                if (local_388.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_388.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_388.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_388.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_0035cf36;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15e2);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b0,
                         "Array length mismatch in SkelAnimation. rotations.default.size {} must be equal to joints.size {} : {}"
                         ,"");
              local_1f0 = (undefined1  [8])
                          ((long)(local_328._M_string_length - (long)local_328._M_dataplus._M_p) >>
                          4);
LAB_0035d52d:
              local_68 = (long)local_3c8.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_3c8.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
              fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                        ((string *)&stack0xfffffffffffffc08,(fmt *)&local_3b0,(string *)local_1f0,
                         &local_68,(unsigned_long *)local_3d8,in_R9);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                         ,0x5b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x15df);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
              pcVar28 = "Failed to get `rotations` attribute in SkelAnimation: {}";
              pcVar24 = "";
LAB_0035d023:
              local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b0,pcVar28,pcVar24);
              fmt::format<tinyusdz::Path>((string *)&stack0xfffffffffffffc08,&local_3b0,local_3d8);
            }
            poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,
                                 (char *)CONCAT44(in_stack_fffffffffffffc0c,
                                                  in_stack_fffffffffffffc08),
                                 CONCAT44(fStack_3ec,fStack_3f0));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) != &local_3e8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                              local_3e8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
              operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append
                      ((char *)&local_3d0->_err,
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) != &local_3e8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                              local_3e8._M_allocated_capacity + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            ::std::ios_base::~ios_base(local_178);
            if (local_328._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(local_328._M_dataplus._M_p,
                              local_328.field_2._0_8_ - (long)local_328._M_dataplus._M_p);
            }
          }
          if (local_388.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_388.
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_388.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_388.
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          bVar16 = true;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
          poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x155e);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
          local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3b0,
                     "Failed to get `scales` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                     ,"");
          fmt::format<tinyusdz::Path>((string *)&stack0xfffffffffffffc08,&local_3b0,local_3d8);
          poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,
                               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08)
                               ,CONCAT44(fStack_3ec,fStack_3f0));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) != &local_3e8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                            local_3e8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
            operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append
                    ((char *)&local_3d0->_err,
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08) != &local_3e8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                            local_3e8._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          ::std::ios_base::~ios_base(local_178);
          bVar16 = true;
        }
LAB_0035d65d:
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
        ::~vector(&local_288._samples);
        if ((optional<tinyusdz::Path::PathType>)local_2a8._0_8_ !=
            (optional<tinyusdz::Path::PathType>)0x0) {
          operator_delete((void *)local_2a8._0_8_,
                          CONCAT62(local_2a8._18_6_,local_2a8._16_2_) - local_2a8._0_8_);
        }
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
        ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                   *)local_348);
        if ((pointer)local_368._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_368._0_8_,
                          CONCAT62(local_368._18_6_,local_368._16_2_) - local_368._0_8_);
        }
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
        ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                   *)local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_308._0_8_,
                          CONCAT62(local_2f8._M_allocated_capacity._2_6_,
                                   local_2f8._M_allocated_capacity._0_2_) - local_308._0_8_);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)(local_238 + 0x10),(_Link_type)_Stack_220._M_parent);
        ::std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_258,(_Link_type)CONCAT62(local_258._18_6_,local_258._16_2_));
        skelAnim = (SkelAnimation *)local_2c8._24_8_;
        if (!bVar16) goto LAB_0035d706;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
        poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1554);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
        local_2a8._0_8_ = (long)local_2a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,
                   "Failed to get `translations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                   ,"");
        fmt::format<tinyusdz::Path>((string *)local_368,(string *)local_2a8,local_3d8);
        poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,(char *)local_368._0_8_,
                             CONCAT62(local_368._10_6_,local_368._8_2_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
        if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,CONCAT62(local_368._18_6_,local_368._16_2_) + 1);
        }
        if (local_2a8._0_8_ != (long)local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,CONCAT62(local_2a8._18_6_,local_2a8._16_2_) + 1);
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&local_3d0->_err,local_368._0_8_);
        if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
          operator_delete((void *)local_368._0_8_,CONCAT62(local_368._18_6_,local_368._16_2_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        ::std::ios_base::~ios_base(local_178);
LAB_0035bccb:
        ::std::
        vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
        ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                   *)local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_308._0_8_,
                          CONCAT62(local_2f8._M_allocated_capacity._2_6_,
                                   local_2f8._M_allocated_capacity._0_2_) - local_308._0_8_);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)(local_238 + 0x10),(_Link_type)_Stack_220._M_parent);
        ::std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_258,(_Link_type)CONCAT62(local_258._18_6_,local_258._16_2_));
      }
LAB_0035dee1:
      bVar16 = false;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  else {
    pSVar6 = env->stage;
    local_1e8._0_8_ = local_1d8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"blendShapes","");
    psVar25 = &local_3d0->_err;
    bVar16 = EvaluateTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                       (pSVar6,&skelAnim->blendShapes,(string *)local_1e8,
                        (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_2c8,
                        psVar25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
    }
    if (bVar16) {
      if ((((skelAnim->blendShapeWeights)._attrib.has_value_ != false) ||
          ((skelAnim->blendShapeWeights)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           (skelAnim->blendShapeWeights)._paths.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_start)) ||
         (((skelAnim->blendShapeWeights)._value_empty != false ||
          ((skelAnim->blendShapeWeights)._blocked != false)))) goto LAB_0035b066;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
      poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x153d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
      pcVar28 = "`blendShapeWeights` must be authored for SkelAnimation Prim {}";
      pcVar24 = "";
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"ConvertSkelAnimation",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
      poVar20 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0x1539);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
      pcVar28 = "Failed to evaluate `blendShapes` in SkelAnimation Prim : {}";
      pcVar24 = "";
    }
    local_308._0_8_ = &local_2f8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_308,pcVar28,pcVar24);
    fmt::format<tinyusdz::Path>((string *)local_258,(string *)local_308,local_3d8);
    poVar20 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,(char *)local_258._0_8_,
                         CONCAT44(local_258._12_4_,CONCAT22(local_258._10_2_,local_258._8_2_)));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_,CONCAT62(local_258._18_6_,local_258._16_2_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT62(local_2f8._M_allocated_capacity._2_6_,
                               local_2f8._M_allocated_capacity._0_2_) + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)psVar25,local_258._0_8_);
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_,CONCAT62(local_258._18_6_,local_258._16_2_) + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    ::std::ios_base::~ios_base(local_178);
    bVar16 = false;
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_2c8);
LAB_0035dfed:
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_3c8);
  return bVar16;
}

Assistant:

bool RenderSceneConverter::ConvertSkelAnimation(const RenderSceneConverterEnv &env,
                                            const Path &abs_path,
                                            const SkelAnimation &skelAnim,
                                            Animation *anim_out) {
  // The spec says
  // """
  // An animation source is only valid if its translation, rotation, and scale components are all authored, storing arrays size to the same size as the authored joints array.
  // """
  //
  // SkelAnimation contains
  // - Joint animations(translation, rotation, scale)
  // - BlendShape animations(weights)

  std::vector<value::token> joints;

  if (skelAnim.joints.authored()) {
    if (!EvaluateTypedAttribute(env.stage, skelAnim.joints, "joints", &joints, &_err)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to evaluate `joints` in SkelAnimation Prim : {}", abs_path));
    }

    if (!skelAnim.rotations.authored() ||
        !skelAnim.translations.authored() ||
        !skelAnim.scales.authored()) {

      PUSH_ERROR_AND_RETURN(fmt::format("`translations`, `rotations` and `scales` must be all authored for SkelAnimation Prim {}. authored flags: translations {}, rotations {}, scales {}", abs_path, skelAnim.translations.authored() ? "yes" : "no",
      skelAnim.rotations.authored() ? "yes" : "no",
      skelAnim.scales.authored() ? "yes" : "no"));
    }
  }

  // TODO: inbetweens BlendShape
  std::vector<value::token> blendShapes;
  if (skelAnim.blendShapes.authored()) {
    if (!EvaluateTypedAttribute(env.stage, skelAnim.blendShapes, "blendShapes", &blendShapes, &_err)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to evaluate `blendShapes` in SkelAnimation Prim : {}", abs_path));
    }

    if (!skelAnim.blendShapeWeights.authored()) {
      PUSH_ERROR_AND_RETURN(fmt::format("`blendShapeWeights` must be authored for SkelAnimation Prim {}", abs_path));
    }

  }


  //
  // Reorder values[channels][timeCode][jointId] into values[jointId][channels][timeCode]
  //

  std::map<std::string, std::map<AnimationChannel::ChannelType, AnimationChannel>> channelMap;

  // Joint animations
  if (joints.size()) {
    StringAndIdMap jointIdMap;

    for (const auto &joint : joints) {
      uint64_t id = jointIdMap.size();
      jointIdMap.add(joint.str(), id);
    }

    Animatable<std::vector<value::float3>> translations;
    if (!skelAnim.translations.get_value(&translations)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `translations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    Animatable<std::vector<value::quatf>> rotations;
    if (!skelAnim.rotations.get_value(&rotations)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `rotations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    Animatable<std::vector<value::half3>> scales;
    if (!skelAnim.scales.get_value(&scales)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `scales` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    DCOUT("translations: has_timesamples " << translations.has_timesamples());
    DCOUT("translations: has_default " << translations.has_default());
    DCOUT("rotations: has_timesamples " << rotations.has_timesamples());
    DCOUT("rotations: has_default " << rotations.has_default());
    DCOUT("scales: has_timesamples " << scales.has_timesamples());
    DCOUT("scales: has_default " << scales.has_default());

    //
    // timesamples value
    //

    if (translations.has_timesamples()) {
      DCOUT("Convert ttranslations");
      const TypedTimeSamples<std::vector<value::float3>> &ts_txs = translations.get_timesamples();

      if (ts_txs.get_samples().empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`translations` timeSamples in SkelAnimation is empty : {}", abs_path));
      }

      for (const auto &sample : ts_txs.get_samples()) {
        if (!sample.blocked) {
          // length check
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} translations.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }

          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float3> s;
            s.t = float(sample.t);
            s.value = sample.value[j];

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Translation];
            if (it.translations.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Translation;
            }
            it.translations.samples.push_back(s);
          }

        }
      }
    }

    if (rotations.has_timesamples()) {
      const TypedTimeSamples<std::vector<value::quatf>> &ts_rots = rotations.get_timesamples();
      DCOUT("Convert rotations");
      for (const auto &sample : ts_rots.get_samples()) {
        if (!sample.blocked) {
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} rotations.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }
          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float4> s;
            s.t = float(sample.t);
            s.value[0] = sample.value[j][0];
            s.value[1] = sample.value[j][1];
            s.value[2] = sample.value[j][2];
            s.value[3] = sample.value[j][3];

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Rotation];
            if (it.rotations.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Rotation;
            }
            it.rotations.samples.push_back(s);
          }

        }
      }
    }

    if (scales.has_timesamples()) {
      const TypedTimeSamples<std::vector<value::half3>> &ts_scales = scales.get_timesamples();
      DCOUT("Convert scales");
      for (const auto &sample : ts_scales.get_samples()) {
        if (!sample.blocked) {
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} scales.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }

          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float3> s;
            s.t = float(sample.t);
            s.value[0] = value::half_to_float(sample.value[j][0]);
            s.value[1] = value::half_to_float(sample.value[j][1]);
            s.value[2] = value::half_to_float(sample.value[j][2]);

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Scale];
            if (it.scales.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Scale;
            }
            it.scales.samples.push_back(s);
          }

        }
      }
    }

    //
    // value at 'default' time.
    //

    // Get value and also do length check for scalar(non timeSampled) animation value.
    if (translations.has_default()) {
      DCOUT("translation at default time");
      std::vector<value::float3> translation;
      if (!translations.get_scalar(&translation)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `translations` attribute in SkelAnimation: {}", abs_path));
      }
      if (translation.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. translations.default.size {} must be equal to joints.size {} : {}", translation.size(), joints.size(), abs_path));
      }

      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Translation];
        it.translations.static_value = translation[j];
      }
    }

    if (rotations.has_default()) {
      DCOUT("rotations at default time");
      std::vector<value::float4> rotation;
      std::vector<value::quatf> _rotation;
      if (!rotations.get_scalar(&_rotation)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `rotations` attribute in SkelAnimation: {}", abs_path));
      }
      if (_rotation.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. rotations.default.size {} must be equal to joints.size {} : {}", _rotation.size(), joints.size(), abs_path));
      }
      std::transform(_rotation.begin(), _rotation.end(), std::back_inserter(rotation), [](const value::quatf &v) {
        value::float4 ret;
        // pxrUSD's TfQuat also uses xyzw memory order.
        ret[0] = v[0];
        ret[1] = v[1];
        ret[2] = v[2];
        ret[3] = v[3];
        return ret;
      });

      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Rotation];
        it.rotations.static_value = rotation[j];
      }
    }

    if (scales.has_default()) {
      DCOUT("scales at default time");
      std::vector<value::float3> scale;
      std::vector<value::half3> _scale;
      if (!scales.get_scalar(&_scale)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `scales` attribute in SkelAnimation: {}", abs_path));
      }
      if (_scale.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. scale.default.size {} must be equal to joints.size {} : {}", _scale.size(), joints.size(), abs_path));
      }
      // half -> float
      std::transform(_scale.begin(), _scale.end(), std::back_inserter(scale), [](const value::half3 &v) {
        value::float3 ret;
        ret[0] = value::half_to_float(v[0]);
        ret[1] = value::half_to_float(v[1]);
        ret[2] = value::half_to_float(v[2]);
        return ret;
      });
      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Scale];
        it.scales.static_value = scale[j];
      }
    }


#if 0 // TODO: remove
    if (!is_translations_timesamples) {
      DCOUT("Reorder translation samples");
      // Create a channel value with single-entry
      // Use USD TimeCode::Default for static sample.
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].type = AnimationChannel::ChannelType::Translation;

        AnimationSample<value::float3> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        s.value = translation[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].translations.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].translations.samples.push_back(s);
      }
    }

    if (!is_rotations_timesamples) {
      DCOUT("Reorder rotation samples");
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].type = AnimationChannel::ChannelType::Rotation;

        AnimationSample<value::float4> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        DCOUT("rot joint_id " << joint_id);
        s.value = rotation[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].rotations.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].rotations.samples.push_back(s);
      }
    }

    if (!is_scales_timesamples) {
      DCOUT("Reorder scale samples");
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].type = AnimationChannel::ChannelType::Scale;

        AnimationSample<value::float3> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        s.value = scale[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].scales.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].scales.samples.push_back(s);
      }
    }
#endif
  }

  // BlendShape animations
  if (blendShapes.size()) {

    std::map<std::string, AnimationSampler<float>> weightsMap;

    // Blender 4.1 may export empty bendShapeWeights. We'll accept it.
    //
    // float[] blendShapeWeights
    if (skelAnim.blendShapeWeights.is_value_empty()) {
      for (const auto &bs : blendShapes) {
        weightsMap[bs.str()].static_value = 1.0f;
      }
    } else {

      Animatable<std::vector<float>> weights;
      if (!skelAnim.blendShapeWeights.get_value(&weights)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `blendShapeWeights` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
      }

      if (weights.has_timesamples()) {

        const TypedTimeSamples<std::vector<float>> &ts_weights = weights.get_timesamples();
        DCOUT("Convert timeSampledd weights");
        for (const auto &sample : ts_weights.get_samples()) {
          if (!sample.blocked) {
            if (sample.value.size() != blendShapes.size()) {
              PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} blendShapeWeights.size {} must be equal to blendShapes.size {} : {}", sample.t, sample.value.size(), blendShapes.size(), abs_path));
            }

            for (size_t j = 0; j < sample.value.size(); j++) {
              AnimationSample<float> s;
              s.t = float(sample.t);
              s.value = sample.value[j];

              const std::string &targetName = blendShapes[j].str();
              weightsMap[targetName].samples.push_back(s);
            }

          }
        }
      }

      if (weights.has_default()) {
        std::vector<float> ws;
        if (!weights.get_scalar(&ws)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to get default value of `blendShapeWeights` attribute of SkelAnimation is invalid : {}", abs_path));
        }

        if (ws.size() != blendShapes.size()) {
          PUSH_ERROR_AND_RETURN(fmt::format("blendShapeWeights.size {} must be equal to blendShapes.size {} : {}", ws.size(), blendShapes.size(), abs_path));
        }

        for (size_t i = 0; i < blendShapes.size(); i++) {
          weightsMap[blendShapes[i].str()].static_value = ws[i];
        }

      } else {
        PUSH_ERROR_AND_RETURN(fmt::format("Internal error. `blendShapeWeights` attribute of SkelAnimation is invalid : {}", abs_path));
      }

    }

    anim_out->blendshape_weights_map = std::move(weightsMap);
  }

  anim_out->abs_path = abs_path.full_path_name();
  anim_out->prim_name = skelAnim.name;
  anim_out->display_name = skelAnim.metas().displayName.value_or("");

  anim_out->channels_map = std::move(channelMap);

  return true;
}